

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O0

void __thiscall StringType::GenDynamicSize(StringType *this,Output *out_cc,Env *env,DataPtr *data)

{
  long *plVar1;
  FILE *__stream;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  StringType *in_RDX;
  Output *in_RSI;
  Type *in_RDI;
  undefined1 unaff_retaddr;
  ID *in_stack_00000008;
  Env *in_stack_00000010;
  Env *in_stack_00000028;
  Output *in_stack_00000030;
  Type *in_stack_00000038;
  DataPtr *in_stack_00000068;
  Env *in_stack_00000070;
  Output *in_stack_00000078;
  StringType *in_stack_00000080;
  StringType *id;
  StringType *in_stack_ffffffffffffffa0;
  ID *in_stack_ffffffffffffffb0;
  Env *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar5;
  StringType *this_00;
  
  __stream = _stderr;
  if (FLAGS_pac_debug) {
    Type::value_var(in_RDI);
    pcVar3 = ID::Name((ID *)0x14ab6f);
    fprintf(__stream,"Generating dynamic size for string `%s\'\n",pcVar3);
  }
  this_00 = in_RDX;
  string_length_var(in_stack_ffffffffffffffa0);
  bVar2 = Env::Evaluated(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (!bVar2) {
    plVar1 = *(long **)&in_RDI[1].super_Object.filename;
    (**(code **)(*plVar1 + 0x38))(plVar1,in_RSI,in_RDX);
    iVar5 = *(int *)&in_RDI->field_0x18c;
    if (iVar5 != 0) {
      if (iVar5 == 1) {
        GenDynamicSizeRegEx(in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068)
        ;
      }
      else if (iVar5 == 2) {
        GenDynamicSizeAnyStr(this,out_cc,env,data);
      }
    }
    bVar2 = Type::incremental_input(in_RDI);
    if ((!bVar2) &&
       (bVar2 = Type::AddSizeVar(in_stack_00000038,in_stack_00000030,in_stack_00000028), bVar2)) {
      id = in_RDX;
      Type::size_var(&in_stack_ffffffffffffffa0->super_Type);
      pcVar3 = Env::LValue((Env *)in_stack_ffffffffffffffa0,(ID *)id);
      string_length_var(in_RDX);
      pcVar4 = Env::RValue((Env *)this_00,(ID *)CONCAT44(iVar5,in_stack_ffffffffffffffc0));
      Output::println(in_RSI,"%s = %s;",pcVar3,pcVar4);
      Type::size_var(&in_RDX->super_Type);
      Env::SetEvaluated(in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr);
    }
  }
  return;
}

Assistant:

void StringType::GenDynamicSize(Output* out_cc, Env* env, const DataPtr& data)
	{
	ASSERT(StaticSize(env) < 0);
	DEBUG_MSG("Generating dynamic size for string `%s'\n", value_var()->Name());

	if ( env->Evaluated(string_length_var()) )
		return;

	string_length_var_field_->GenTempDecls(out_cc, env);

	switch ( type_ )
		{
		case ANYSTR:
			GenDynamicSizeAnyStr(out_cc, env, data);
			break;
		case CSTR:
			ASSERT(0);
			break;
		case REGEX:
			// TODO: static size for a regular expression?
			GenDynamicSizeRegEx(out_cc, env, data);
			break;
		}

	if ( ! incremental_input() && AddSizeVar(out_cc, env) )
		{
		out_cc->println("%s = %s;", env->LValue(size_var()), env->RValue(string_length_var()));
		env->SetEvaluated(size_var());
		}
	}